

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QListView::dropEvent(QListView *this,QDropEvent *event)

{
  long *plVar1;
  char cVar2;
  bool bVar3;
  DragDropMode DVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  QListView *pQVar8;
  iterator iVar9;
  iterator iVar10;
  QAbstractItemModel *pQVar11;
  QPersistentModelIndex *pIndex;
  QModelIndex *index;
  QModelIndex *lhs;
  long lVar12;
  long in_FS_OFFSET;
  bool bVar13;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  QModelIndex local_b8;
  QPersistentModelIndex dropRow;
  QArrayDataPointer<QPersistentModelIndex> local_98;
  QArrayDataPointer<QModelIndex> local_78;
  int row;
  int col;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                      super_QWidget.field_0x8;
  if (*(int *)(event + 0x2c) == 2) {
    bVar13 = false;
  }
  else {
    DVar4 = QAbstractItemView::dragDropMode((QAbstractItemView *)this);
    bVar13 = DVar4 != InternalMove;
  }
  pQVar8 = (QListView *)QDropEvent::source();
  if ((bVar13) || (pQVar8 != this)) goto LAB_00512ebe;
  local_50.r = -1;
  local_50.c = -1;
  col = -1;
  row = -1;
  local_50.i = 0;
  local_50.m.ptr = (QAbstractItemModel *)0x0;
  if ((event[0xc] == (QDropEvent)0x0) &&
     (cVar2 = (**(code **)(*plVar1 + 0x110))(plVar1,event,&row,&col,&local_50), cVar2 != '\0')) {
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d._0_4_ = 0xaaaaaaaa;
    local_78.d._4_4_ = 0xaaaaaaaa;
    local_78.ptr._0_4_ = 0xaaaaaaaa;
    local_78.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2d8))(&local_78,this);
    local_98.d = (Data *)0x0;
    local_98.ptr = (QPersistentModelIndex *)0x0;
    local_98.size = 0;
    QList<QPersistentModelIndex>::reserve((QList<QPersistentModelIndex> *)&local_98,local_78.size);
    lhs = (QModelIndex *)CONCAT44(local_78.ptr._4_4_,local_78.ptr._0_4_);
    lVar12 = local_78.size * 0x18;
    do {
      if (lVar12 == 0) {
        if (((local_50.r < 0) || ((long)local_50._0_8_ < 0)) ||
           (local_50.m.ptr == (QAbstractItemModel *)0x0)) {
          iVar9 = QList<QPersistentModelIndex>::begin((QList<QPersistentModelIndex> *)&local_98);
          iVar10 = QList<QPersistentModelIndex>::end((QList<QPersistentModelIndex> *)&local_98);
          std::__sort<QList<QPersistentModelIndex>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
                    (iVar9.i,iVar10.i);
          dropRow.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
          pQVar11 = QAbstractItemView::model((QAbstractItemView *)this);
          (**(code **)(*(long *)pQVar11 + 0x60))(&local_b8,pQVar11,row,col,&local_50);
          QPersistentModelIndex::QPersistentModelIndex(&dropRow,&local_b8);
          if (row == -1) {
            pQVar11 = QAbstractItemView::model((QAbstractItemView *)this);
            local_b8.r = -1;
            local_b8.c = -1;
            local_b8.i = 0;
            local_b8.m.ptr = (QAbstractItemModel *)0x0;
            iVar6 = (**(code **)(*(long *)pQVar11 + 0x78))(pQVar11);
          }
          else {
            iVar5 = QPersistentModelIndex::row();
            iVar6 = row;
            if (-1 < iVar5) {
              iVar6 = QPersistentModelIndex::row();
            }
          }
          lVar12 = local_98.size << 3;
          bVar3 = false;
          goto LAB_00512dda;
        }
        break;
      }
      QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_b8,lhs);
      QList<QPersistentModelIndex>::emplaceBack<QPersistentModelIndex>
                ((QList<QPersistentModelIndex> *)&local_98,(QPersistentModelIndex *)&local_b8);
      QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_b8);
      bVar3 = ::comparesEqual(lhs,&local_50);
      lhs = lhs + 1;
      lVar12 = lVar12 + -0x18;
    } while (!bVar3);
    goto LAB_00512e8f;
  }
  goto LAB_00512eb0;
LAB_00512dda:
  if (lVar12 == 0) goto LAB_00512e7b;
  iVar5 = QPersistentModelIndex::row();
  if ((iVar6 == iVar5) || (iVar5 = QPersistentModelIndex::row(), iVar6 == iVar5 + 1)) {
LAB_00512e5f:
    iVar6 = QPersistentModelIndex::row();
    iVar6 = iVar6 + 1;
    bVar3 = true;
  }
  else {
    pQVar11 = QAbstractItemView::model((QAbstractItemView *)this);
    local_b8.r = -1;
    local_b8.c = -1;
    local_b8.i = 0;
    local_b8.m.ptr = (QAbstractItemModel *)0x0;
    uVar7 = QPersistentModelIndex::row();
    local_d0 = 0xffffffffffffffff;
    local_c8 = 0;
    uStack_c0 = 0;
    cVar2 = (**(code **)(*(long *)pQVar11 + 0x118))(pQVar11,&local_b8,uVar7,1,&local_d0,iVar6);
    if (cVar2 != '\0') goto LAB_00512e5f;
  }
  lVar12 = lVar12 + -8;
  goto LAB_00512dda;
LAB_00512e7b:
  if (bVar3) {
    event[0xc] = (QDropEvent)0x1;
  }
  QPersistentModelIndex::~QPersistentModelIndex(&dropRow);
LAB_00512e8f:
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_78);
LAB_00512eb0:
  if (event[0xc] == (QDropEvent)0x1) {
    *(undefined1 *)((long)plVar1 + 0x3e5) = 1;
  }
LAB_00512ebe:
  cVar2 = (**(code **)(*(long *)plVar1[0xa8] + 0xb8))((long *)plVar1[0xa8],event);
  if ((cVar2 == '\0') || ((*(byte *)((long)plVar1 + 0x3e5) & 1) == 0)) {
    if (!bVar13 && (*(byte *)((long)plVar1 + 0x3e5) & 1) == 0) {
      event[0xc] = (QDropEvent)0x0;
    }
    QAbstractItemView::dropEvent((QAbstractItemView *)this,event);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::dropEvent(QDropEvent *event)
{
    Q_D(QListView);

    const bool moveAction = event->dropAction() == Qt::MoveAction
                         || dragDropMode() == QAbstractItemView::InternalMove;
    if (event->source() == this && moveAction) {
        QModelIndex topIndex;
        bool topIndexDropped = false;
        int col = -1;
        int row = -1;
        // check whether a subclass has already accepted the event, ie. moved the data
        if (!event->isAccepted() && d->dropOn(event, &row, &col, &topIndex)) {
            const QList<QModelIndex> selIndexes = selectedIndexes();
            QList<QPersistentModelIndex> persIndexes;
            persIndexes.reserve(selIndexes.size());

            for (const auto &index : selIndexes) {
                persIndexes.append(index);
                if (index == topIndex) {
                    topIndexDropped = true;
                    break;
                }
            }

            if (!topIndexDropped && !topIndex.isValid()) {
                std::sort(persIndexes.begin(), persIndexes.end()); // The dropped items will remain in the same visual order.

                QPersistentModelIndex dropRow = model()->index(row, col, topIndex);

                int r = row == -1 ? model()->rowCount() : (dropRow.row() >= 0 ? dropRow.row() : row);
                bool dataMoved = false;
                for (const QPersistentModelIndex &pIndex : std::as_const(persIndexes)) {
                    // only generate a move when not same row or behind itself
                    if (r != pIndex.row() && r != pIndex.row() + 1) {
                        // try to move (preserves selection)
                        const bool moved = model()->moveRow(QModelIndex(), pIndex.row(), QModelIndex(), r);
                        if (!moved)
                            continue; // maybe it'll work for other rows
                        dataMoved = true; // success
                    } else {
                        // move onto itself is blocked, don't delete anything
                        dataMoved = true;
                    }
                    r = pIndex.row() + 1;   // Dropped items are inserted contiguously and in the right order.
                }
                if (dataMoved)
                    event->accept();
            }
        }

        // either we or a subclass accepted the move event, so assume that the data was
        // moved and that QAbstractItemView shouldn't remove the source when QDrag::exec returns
        if (event->isAccepted())
            d->dropEventMoved = true;
    }

    if (!d->commonListView->filterDropEvent(event) || !d->dropEventMoved) {
        // icon view didn't move the data, and moveRows not implemented, so fall back to default
        if (!d->dropEventMoved && moveAction)
            event->ignore();
        QAbstractItemView::dropEvent(event);
    }
}